

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O3

void __thiscall
cmCTestBuildHandler::GenerateXMLLogScraped(cmCTestBuildHandler *this,cmXMLWriter *xml)

{
  string *path;
  cmCTest *this_00;
  pointer pcVar1;
  int iVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  int iVar5;
  long lVar6;
  pointer pcVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  pointer pcVar9;
  char *pcVar10;
  pointer pcVar11;
  int iVar12;
  string srcdir;
  string local_90;
  byte local_6d;
  int local_6c;
  cmCTestBuildHandler *local_68;
  int local_5c;
  string local_58;
  ulong local_38;
  
  iVar5 = this->MaxErrors;
  iVar12 = this->MaxWarnings;
  this_00 = (this->super_cmCTestGenericHandler).CTest;
  paVar8 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar8;
  local_68 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"SourceDirectory","");
  cmCTest::GetCTestConfiguration(&local_58,this_00,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar8) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  cmsys::SystemTools::CollapseFullPath(&local_90,&local_58);
  std::__cxx11::string::operator=((string *)&local_58,(string *)&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar8) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::string::append((char *)&local_58);
  pcVar11 = (local_68->ErrorsAndWarnings).
            super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pcVar7 = (local_68->ErrorsAndWarnings).
           super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pcVar11 != pcVar7) {
    do {
      paVar8 = &local_90.field_2;
      if (iVar5 == 0 && iVar12 == 0) break;
      bVar4 = pcVar11->Error;
      iVar2 = iVar12;
      if (bVar4 != false) {
        iVar2 = iVar5;
      }
      local_6c = iVar12;
      if (iVar2 != 0) {
        local_38 = (ulong)(bVar4 ^ 1);
        pcVar10 = "Warning";
        if (bVar4 != false) {
          pcVar10 = "Error";
        }
        local_90._M_dataplus._M_p = (pointer)paVar8;
        local_6d = bVar4;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,pcVar10,pcVar10 + local_38 * 2 + 5);
        cmXMLWriter::StartElement(xml,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != paVar8) {
          operator_delete(local_90._M_dataplus._M_p,
                          CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                   local_90.field_2._M_local_buf[0]) + 1);
        }
        local_90._M_dataplus._M_p = (pointer)paVar8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"BuildLogLine","");
        cmXMLWriter::Element<int>(xml,&local_90,&pcVar11->LogLine);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != paVar8) {
          operator_delete(local_90._M_dataplus._M_p,
                          CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                   local_90.field_2._M_local_buf[0]) + 1);
        }
        local_90._M_dataplus._M_p = (pointer)paVar8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Text","");
        cmXMLWriter::StartElement(xml,&local_90);
        cmXMLWriter::Content<std::__cxx11::string>(xml,&pcVar11->Text);
        cmXMLWriter::EndElement(xml);
        local_5c = iVar5;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != paVar8) {
          operator_delete(local_90._M_dataplus._M_p,
                          CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                   local_90.field_2._M_local_buf[0]) + 1);
        }
        pcVar1 = (local_68->ErrorWarningFileLineRegex).
                 super__Vector_base<cmCTestBuildHandler::cmCTestCompileErrorWarningRex,_std::allocator<cmCTestBuildHandler::cmCTestCompileErrorWarningRex>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pcVar9 = (local_68->ErrorWarningFileLineRegex).
                      super__Vector_base<cmCTestBuildHandler::cmCTestCompileErrorWarningRex,_std::allocator<cmCTestBuildHandler::cmCTestCompileErrorWarningRex>_>
                      ._M_impl.super__Vector_impl_data._M_start; pcVar9 != pcVar1;
            pcVar9 = pcVar9 + 1) {
          bVar4 = cmsys::RegularExpression::find
                            (&pcVar9->RegularExpression,(pcVar11->Text)._M_dataplus._M_p,
                             &(pcVar9->RegularExpression).regmatch);
          if (bVar4) {
            pcVar10 = (pcVar9->RegularExpression).regmatch.startp[pcVar9->FileIndex];
            if (pcVar10 == (char *)0x0) {
              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
              local_90._M_string_length = 0;
              local_90.field_2._M_local_buf[0] = '\0';
            }
            else {
              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_90,pcVar10,
                         (pcVar9->RegularExpression).regmatch.endp[pcVar9->FileIndex]);
            }
            path = &pcVar11->SourceFile;
            std::__cxx11::string::operator=((string *)path,(string *)&local_90);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p,
                              CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                       local_90.field_2._M_local_buf[0]) + 1);
            }
            cmsys::SystemTools::ConvertToUnixSlashes(path);
            lVar6 = std::__cxx11::string::find((char *)path,0x52d514,0);
            if (lVar6 == -1) {
              cmsys::SystemTools::CollapseFullPath(&local_90,path);
              std::__cxx11::string::operator=((string *)path,(string *)&local_90);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p != &local_90.field_2) {
                operator_delete(local_90._M_dataplus._M_p,
                                CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                         local_90.field_2._M_local_buf[0]) + 1);
              }
              cmsys::SystemTools::ReplaceString(path,local_58._M_dataplus._M_p,"");
            }
            else {
              cmsys::SystemTools::ReplaceString(path,"/.../","");
              lVar6 = std::__cxx11::string::find((char)path,0x2f);
              if (lVar6 != -1) {
                std::__cxx11::string::substr((ulong)&local_90,(ulong)path);
                std::__cxx11::string::operator=((string *)path,(string *)&local_90);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_90._M_dataplus._M_p != &local_90.field_2) {
                  operator_delete(local_90._M_dataplus._M_p,
                                  CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                           local_90.field_2._M_local_buf[0]) + 1);
                }
              }
            }
            pcVar10 = (pcVar9->RegularExpression).regmatch.startp[pcVar9->LineIndex];
            if (pcVar10 == (char *)0x0) {
              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
              local_90._M_string_length = 0;
              local_90.field_2._M_local_buf[0] = '\0';
              iVar5 = atoi(local_90._M_dataplus._M_p);
              pcVar11->LineNumber = iVar5;
            }
            else {
              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_90,pcVar10,
                         (pcVar9->RegularExpression).regmatch.endp[pcVar9->LineIndex]);
              _Var3._M_p = local_90._M_dataplus._M_p;
              iVar5 = atoi(local_90._M_dataplus._M_p);
              pcVar11->LineNumber = iVar5;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var3._M_p != &local_90.field_2) {
                operator_delete(_Var3._M_p,
                                CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                         local_90.field_2._M_local_buf[0]) + 1);
              }
            }
            break;
          }
        }
        iVar5 = local_5c;
        paVar8 = &local_90.field_2;
        if (((pcVar11->SourceFile)._M_string_length != 0) && (-1 < pcVar11->LineNumber)) {
          local_90._M_dataplus._M_p = (pointer)paVar8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"SourceFile","");
          cmXMLWriter::StartElement(xml,&local_90);
          cmXMLWriter::Content<std::__cxx11::string>(xml,&pcVar11->SourceFile);
          cmXMLWriter::EndElement(xml);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != paVar8) {
            operator_delete(local_90._M_dataplus._M_p,
                            CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                     local_90.field_2._M_local_buf[0]) + 1);
          }
          if ((pcVar11->SourceFileTail)._M_string_length != 0) {
            local_90._M_dataplus._M_p = (pointer)paVar8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"SourceFileTail","")
            ;
            cmXMLWriter::StartElement(xml,&local_90);
            cmXMLWriter::Content<std::__cxx11::string>(xml,&pcVar11->SourceFileTail);
            cmXMLWriter::EndElement(xml);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != paVar8) {
              operator_delete(local_90._M_dataplus._M_p,
                              CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                       local_90.field_2._M_local_buf[0]) + 1);
            }
          }
          if (-1 < pcVar11->LineNumber) {
            local_90._M_dataplus._M_p = (pointer)paVar8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_90,"SourceLineNumber","");
            cmXMLWriter::Element<int>(xml,&local_90,&pcVar11->LineNumber);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != paVar8) {
              operator_delete(local_90._M_dataplus._M_p,
                              CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                       local_90.field_2._M_local_buf[0]) + 1);
            }
          }
        }
        local_90._M_dataplus._M_p = (pointer)paVar8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"PreContext","");
        cmXMLWriter::StartElement(xml,&local_90);
        cmXMLWriter::Content<std::__cxx11::string>(xml,&pcVar11->PreContext);
        cmXMLWriter::EndElement(xml);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != paVar8) {
          operator_delete(local_90._M_dataplus._M_p,
                          CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                   local_90.field_2._M_local_buf[0]) + 1);
        }
        local_90._M_dataplus._M_p = (pointer)paVar8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"PostContext","");
        cmXMLWriter::StartElement(xml,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != paVar8) {
          operator_delete(local_90._M_dataplus._M_p,
                          CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                   local_90.field_2._M_local_buf[0]) + 1);
        }
        cmXMLWriter::Content<std::__cxx11::string>(xml,&pcVar11->PostContext);
        local_6c = local_6c - (int)local_38;
        iVar5 = iVar5 - (uint)local_6d;
        iVar12 = local_6c;
        if (pcVar11->Error != false) {
          iVar12 = iVar5;
        }
        if (iVar12 == 0) {
          cmXMLWriter::Content<char[72]>
                    (xml,(char (*) [72])
                         "\nThe maximum number of reported warnings or errors has been reached!!!\n"
                    );
        }
        cmXMLWriter::EndElement(xml);
        local_90._M_dataplus._M_p = (pointer)paVar8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"RepeatCount","");
        cmXMLWriter::StartElement(xml,&local_90);
        cmXMLWriter::Content<char[2]>(xml,(char (*) [2])0x5897be);
        cmXMLWriter::EndElement(xml);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != paVar8) {
          operator_delete(local_90._M_dataplus._M_p,
                          CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                   local_90.field_2._M_local_buf[0]) + 1);
        }
        cmXMLWriter::EndElement(xml);
        pcVar7 = (local_68->ErrorsAndWarnings).
                 super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      pcVar11 = pcVar11 + 1;
      iVar12 = local_6c;
    } while (pcVar11 != pcVar7);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmCTestBuildHandler::GenerateXMLLogScraped(cmXMLWriter& xml)
{
  std::vector<cmCTestBuildErrorWarning>& ew = this->ErrorsAndWarnings;
  std::vector<cmCTestBuildErrorWarning>::iterator it;

  // only report the first 50 warnings and first 50 errors
  int numErrorsAllowed = this->MaxErrors;
  int numWarningsAllowed = this->MaxWarnings;
  std::string srcdir = this->CTest->GetCTestConfiguration("SourceDirectory");
  // make sure the source dir is in the correct case on windows
  // via a call to collapse full path.
  srcdir = cmSystemTools::CollapseFullPath(srcdir);
  srcdir += "/";
  for (it = ew.begin();
       it != ew.end() && (numErrorsAllowed || numWarningsAllowed); it++) {
    cmCTestBuildErrorWarning* cm = &(*it);
    if ((cm->Error && numErrorsAllowed) ||
        (!cm->Error && numWarningsAllowed)) {
      if (cm->Error) {
        numErrorsAllowed--;
      } else {
        numWarningsAllowed--;
      }
      xml.StartElement(cm->Error ? "Error" : "Warning");
      xml.Element("BuildLogLine", cm->LogLine);
      xml.Element("Text", cm->Text);
      for (cmCTestCompileErrorWarningRex& rit :
           this->ErrorWarningFileLineRegex) {
        cmsys::RegularExpression* re = &rit.RegularExpression;
        if (re->find(cm->Text)) {
          cm->SourceFile = re->match(rit.FileIndex);
          // At this point we need to make this->SourceFile relative to
          // the source root of the project, so cvs links will work
          cmSystemTools::ConvertToUnixSlashes(cm->SourceFile);
          if (cm->SourceFile.find("/.../") != std::string::npos) {
            cmSystemTools::ReplaceString(cm->SourceFile, "/.../", "");
            std::string::size_type p = cm->SourceFile.find('/');
            if (p != std::string::npos) {
              cm->SourceFile =
                cm->SourceFile.substr(p + 1, cm->SourceFile.size() - p);
            }
          } else {
            // make sure it is a full path with the correct case
            cm->SourceFile = cmSystemTools::CollapseFullPath(cm->SourceFile);
            cmSystemTools::ReplaceString(cm->SourceFile, srcdir.c_str(), "");
          }
          cm->LineNumber = atoi(re->match(rit.LineIndex).c_str());
          break;
        }
      }
      if (!cm->SourceFile.empty() && cm->LineNumber >= 0) {
        if (!cm->SourceFile.empty()) {
          xml.Element("SourceFile", cm->SourceFile);
        }
        if (!cm->SourceFileTail.empty()) {
          xml.Element("SourceFileTail", cm->SourceFileTail);
        }
        if (cm->LineNumber >= 0) {
          xml.Element("SourceLineNumber", cm->LineNumber);
        }
      }
      xml.Element("PreContext", cm->PreContext);
      xml.StartElement("PostContext");
      xml.Content(cm->PostContext);
      // is this the last warning or error, if so notify
      if ((cm->Error && !numErrorsAllowed) ||
          (!cm->Error && !numWarningsAllowed)) {
        xml.Content("\nThe maximum number of reported warnings or errors "
                    "has been reached!!!\n");
      }
      xml.EndElement(); // PostContext
      xml.Element("RepeatCount", "0");
      xml.EndElement(); // "Error" / "Warning"
    }
  }
}